

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int __thiscall iqnet::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  SystemSockAddrIn *__addr_00;
  network_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  __addr_00 = Inet_addr::get_sockaddr((Inet_addr *)CONCAT44(in_register_00000034,__fd));
  iVar1 = ::bind(this->sock,(sockaddr *)__addr_00,0x10);
  if (iVar1 != -1) {
    return iVar1;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Socket::bind",&local_39);
  network_error::network_error(this_00,&local_38,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::bind( const Inet_addr& addr )
{
  const sockaddr* saddr = reinterpret_cast<const sockaddr*>(addr.get_sockaddr());

  if( ::bind( sock, saddr, sizeof(sockaddr_in) ) == -1 )
    throw network_error( "Socket::bind" );
}